

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O1

LabelId __thiscall
optimization::global_expr_move::Global_Expr_Mov::bfs
          (Global_Expr_Mov *this,int start,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  bool bVar3;
  bool bVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  LabelId LVar12;
  _Rb_tree_header *unaff_R13;
  _Array_type *__vtable;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar13;
  int x;
  LabelId p;
  set<int,_std::less<int>,_std::allocator<int>_> disabled_pre;
  int p_1;
  set<int,_std::less<int>,_std::allocator<int>_> prec;
  LabelId local_274;
  Global_Expr_Mov *local_270;
  _Rb_tree_color local_264;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_260;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_230;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_200;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1a0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_170;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_120;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_d0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_80;
  
  local_274 = start;
  local_270 = this;
  pmVar5 = std::
           map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                 *)(*env + 0x68),&local_274);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_1a0,&(pmVar5->preceding)._M_t);
  LVar12 = local_274;
  if (local_1a0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &local_200._M_impl.super__Rb_tree_header;
    local_200._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_200._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_200._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_200._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_200._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (local_1a0._M_impl.super__Rb_tree_header._M_node_count == 1) {
      _Var2 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      local_230._M_impl._0_8_ = &local_80;
      local_80.
      super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ._M_index = (op->
                  super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  ).
                  super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  ._M_index;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_&>
        ::_S_vtable._M_arr
        [(long)(char)local_80.
                     super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     ._M_index + 1]._M_data)((anon_class_8_1_a78179b7_conflict4 *)&local_230,op);
      local_260._M_impl._0_4_ = bfs(local_270,_Var2,&local_80);
      pmVar6 = std::
               map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
               ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                     *)(env + 2),(key_type *)&local_260);
      local_230._M_impl._0_8_ = &local_d0;
      local_d0.
      super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      .
      super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
      ._M_index = (op->
                  super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  ).
                  super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  .
                  super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                  ._M_index;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_&>
        ::_S_vtable._M_arr
        [(long)(char)local_d0.
                     super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     .
                     super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                     ._M_index + 1]._M_data)((anon_class_8_1_a78179b7_conflict4 *)&local_230,op);
      bVar3 = BlockOps::has_op(pmVar6,&local_d0);
      if (bVar3) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_200,(int *)&local_260);
      }
    }
    else {
      get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_230,local_270,
                     local_1a0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&local_200);
      if (local_230._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var11 = &local_230._M_impl.super__Rb_tree_header;
        local_200._M_impl.super__Rb_tree_header._M_header._M_color =
             local_230._M_impl.super__Rb_tree_header._M_header._M_color;
        local_200._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_230._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_200._M_impl.super__Rb_tree_header._M_header._M_left =
             local_230._M_impl.super__Rb_tree_header._M_header._M_left;
        local_200._M_impl.super__Rb_tree_header._M_header._M_right =
             local_230._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_230._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &p_Var1->_M_header;
        local_200._M_impl.super__Rb_tree_header._M_node_count =
             local_230._M_impl.super__Rb_tree_header._M_node_count;
        local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_230._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
        local_230._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_230);
      if ((op->
          super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ).
          super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          .
          super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          ._M_index != '\0') {
        local_230._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_230._M_impl.super__Rb_tree_header._M_header;
        local_230._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_230._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_230._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_230._M_impl.super__Rb_tree_header._M_header._M_right =
             local_230._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)local_200._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1)
        {
          p_Var9 = local_200._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_1d0._M_impl._0_4_ = p_Var9[1]._M_color;
            pmVar6 = std::
                     map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                     ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                           *)(env + 2),(key_type *)&local_1d0);
            local_170.
            super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            .
            super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            .
            super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            .
            super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            .
            super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            .
            super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
            ._M_index = (op->
                        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        ).
                        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        ._M_index;
            local_260._M_impl._0_8_ = &local_170;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_&>
              ::_S_vtable._M_arr
              [(long)(char)local_170.
                           super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           .
                           super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           .
                           super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           .
                           super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           .
                           super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           .
                           super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                           ._M_index + 1]._M_data)
                      ((anon_class_8_1_a78179b7_conflict4 *)&local_260,op);
            bVar3 = BlockOps::disable_op(pmVar6,&local_170);
            if (bVar3) {
              p_Var7 = &local_230._M_impl.super__Rb_tree_header._M_header;
              for (p_Var10 = local_230._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var10 != (_Base_ptr)0x0;
                  p_Var10 = (&p_Var10->_M_left)
                            [(int)p_Var10[1]._M_color < (int)local_1d0._M_impl._0_4_]) {
                if ((int)local_1d0._M_impl._0_4_ <= (int)p_Var10[1]._M_color) {
                  p_Var7 = p_Var10;
                }
              }
              p_Var11 = &local_230._M_impl.super__Rb_tree_header;
              p_Var10 = &p_Var11->_M_header;
              if (((_Rb_tree_header *)p_Var7 != p_Var11) &&
                 (p_Var10 = p_Var7, (int)local_1d0._M_impl._0_4_ < (int)p_Var7[1]._M_color)) {
                p_Var10 = &p_Var11->_M_header;
              }
              if ((_Rb_tree_header *)p_Var10 == p_Var11) {
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&local_230,(int *)&local_1d0);
                get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_260,
                               local_270,local_1d0._M_impl._0_4_);
                for (p_Var8 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
                    (_Rb_tree_header *)p_Var8 != &local_260._M_impl.super__Rb_tree_header;
                    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
                  local_264 = p_Var8[1]._M_color;
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_unique<int_const&>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&local_230,(int *)&local_264);
                }
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree(&local_260);
              }
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var1);
        }
        unaff_R13 = &local_230._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)local_230._M_impl.super__Rb_tree_header._M_header._M_left !=
            unaff_R13) {
          p_Var9 = local_230._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            _Var2 = p_Var9[1]._M_color;
            local_260._M_impl._0_4_ = _Var2;
            p_Var10 = &p_Var1->_M_header;
            for (p_Var7 = local_200._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
                p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)_Var2]) {
              if ((int)_Var2 <= (int)*(size_t *)(p_Var7 + 1)) {
                p_Var10 = p_Var7;
              }
            }
            p_Var11 = p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var11 = (_Rb_tree_header *)p_Var10,
               (int)_Var2 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
              p_Var11 = p_Var1;
            }
            if (p_Var11 != p_Var1) {
              pVar13 = std::
                       _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       ::equal_range(&local_200,(key_type *)&local_260);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_erase_aux(&local_200,(_Base_ptr)pVar13.first._M_node,
                           (_Base_ptr)pVar13.second._M_node);
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != unaff_R13);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_230);
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_1a0,
                       (const_iterator)local_1a0._M_impl.super__Rb_tree_header._M_header._M_left);
      if ((_Rb_tree_header *)local_1a0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_1a0._M_impl.super__Rb_tree_header) {
        p_Var11 = &local_260._M_impl.super__Rb_tree_header;
        unaff_R13 = (_Rb_tree_header *)&local_260;
        p_Var9 = local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          get_precedings((set<int,_std::less<int>,_std::allocator<int>_> *)&local_230,local_270,
                         p_Var9[1]._M_color);
          local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_260._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var11->_M_header;
          local_260._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var11->_M_header;
          std::
          __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_200._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                     local_230._M_impl.super__Rb_tree_header._M_header._M_left,
                     &local_230._M_impl.super__Rb_tree_header,unaff_R13,p_Var11);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _Rb_tree(&local_1d0,
                   (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   unaff_R13);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    (&local_200);
          if (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            local_200._M_impl.super__Rb_tree_header._M_header._M_color =
                 local_1d0._M_impl.super__Rb_tree_header._M_header._M_color;
            local_200._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent;
            local_200._M_impl.super__Rb_tree_header._M_header._M_left =
                 local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
            local_200._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1d0._M_impl.super__Rb_tree_header._M_header._M_right;
            (local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                 &p_Var1->_M_header;
            local_200._M_impl.super__Rb_tree_header._M_node_count =
                 local_1d0._M_impl.super__Rb_tree_header._M_node_count;
            local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_1d0._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_1d0._M_impl.super__Rb_tree_header._M_header;
            local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_1d0._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_1d0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )unaff_R13);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_230);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != &local_1a0._M_impl.super__Rb_tree_header);
      }
    }
    LVar12 = (LabelId)unaff_R13;
    bVar3 = (_Rb_tree_header *)local_200._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1;
    if (!bVar3) {
      p_Var9 = local_200._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_260._M_impl._0_4_ = p_Var9[1]._M_color;
        pmVar6 = std::
                 map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                 ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                       *)(env + 2),(key_type *)&local_260);
        local_120.
        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        ._M_index = (op->
                    super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    ).
                    super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    .
                    super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    .
                    super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    .
                    super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    .
                    super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                    ._M_index;
        local_230._M_impl._0_8_ = &local_120;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_&>
          ::_S_vtable._M_arr
          [(long)(char)local_120.
                       super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       .
                       super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       .
                       super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       .
                       super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       .
                       super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       .
                       super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                       ._M_index + 1]._M_data)((anon_class_8_1_a78179b7_conflict4 *)&local_230,op);
        bVar4 = BlockOps::has_op(pmVar6,&local_120);
        if (bVar4) {
          unaff_R13 = (_Rb_tree_header *)(local_260._M_impl._0_8_ & 0xffffffff);
        }
        LVar12 = (LabelId)unaff_R13;
        if (bVar4) break;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        bVar3 = (_Rb_tree_header *)p_Var9 == p_Var1;
      } while (!bVar3);
    }
    if (bVar3) {
      LVar12 = local_274;
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_200);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1a0);
  return LVar12;
}

Assistant:

mir::types::LabelId bfs(int start, std::variant<Op, LoadOp> op) {
    auto prec = env->func.basic_blks.at(start).preceding;
    if (prec.size() == 0) {
      return start;
    }
    std::set<mir::types::LabelId> res;
    if (prec.size() == 1) {
      auto p = bfs(*prec.begin(), op);
      if (env->blk_op_map.at(p).has_op(op)) {
        res.insert(p);
      }
    } else {
      auto f = *prec.begin();
      res = get_precedings(f);
      if (op.index() != 0) {
        std::set<mir::types::LabelId> disabled_pre;
        for (auto p : res) {
          if (env->blk_op_map.at(p).disable_op(op)) {
            if (disabled_pre.count(p)) {
              continue;
            }
            disabled_pre.insert(p);
            for (auto x : get_precedings(p)) {
              disabled_pre.insert(x);
            }
          }
        }
        for (auto p : disabled_pre) {
          if (res.count(p)) {
            res.erase(p);
          }
        }
      }

      prec.erase(prec.begin());
      for (auto p : prec) {
        auto precs = get_precedings(p);
        std::set<int> tmp;
        std::set_intersection(res.begin(), res.end(), precs.begin(),
                              precs.end(), std::inserter(tmp, tmp.begin()));
        res = std::set(tmp);
      }
    }

    for (auto p : res) {
      if (env->blk_op_map.at(p).has_op(op)) {
        return p;
      }
    }
    return start;
  }